

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_trace.c
# Opt level: O2

void trace_start(jit_State *J)

{
  uint8_t *puVar1;
  IRIns *ir;
  char *pcVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  byte bVar5;
  char cVar6;
  TraceNo TVar7;
  undefined4 uVar8;
  lua_State *L;
  TValue *pTVar9;
  SnapShot *pSVar10;
  IRIns *pIVar11;
  bool bVar12;
  int32_t iVar13;
  ushort uVar14;
  ushort uVar15;
  IRRef1 IVar16;
  uint uVar17;
  TRef TVar18;
  TRef TVar19;
  TRef TVar20;
  GCRef *pGVar21;
  ptrdiff_t argbase;
  GCstr *pGVar22;
  long lVar23;
  GCproto *pGVar24;
  ulong uVar25;
  long lVar26;
  ushort uVar27;
  IRIns *pIVar28;
  GCtrace *T;
  SnapEntry *pSVar29;
  ulong uVar30;
  IRIns *pIVar31;
  IRIns *irs;
  uint uVar32;
  uint uVar33;
  ulong uVar34;
  ulong uVar35;
  IRIns *pIVar36;
  undefined1 auVar37 [16];
  ulong local_78;
  
  if ((J->pt->flags & 8) != 0) {
    if (J->parent == 0) {
      *(char *)J->pc = (char)*J->pc + '\x01';
      puVar1 = &J->pt->flags;
      *puVar1 = *puVar1 | 0x10;
    }
    goto LAB_00121ed5;
  }
  uVar17 = J->freetrace;
  if (uVar17 == 0) {
    J->freetrace = 1;
    uVar17 = 1;
  }
  uVar35 = (ulong)J->sizetrace;
  uVar25 = (ulong)uVar17;
  while (uVar25 < uVar35) {
    pGVar21 = J->trace;
    if (pGVar21[uVar25].gcptr32 == 0) {
      J->freetrace = (int)uVar25 + 1;
      goto LAB_001214c1;
    }
    uVar25 = uVar25 + 1;
    J->freetrace = (TraceNo)uVar25;
  }
  uVar17 = J->param[0] + 1;
  if (0xfffe < uVar17) {
    uVar17 = 0xffff;
  }
  uVar32 = 2;
  if (2 < uVar17) {
    uVar32 = uVar17;
  }
  if (uVar32 <= J->sizetrace) {
LAB_00121ecc:
    lj_trace_flushall(J->L);
LAB_00121ed5:
    J->state = LJ_TRACE_IDLE;
    return;
  }
  pGVar21 = (GCRef *)lj_mem_grow(J->L,J->trace,&J->sizetrace,uVar32,4);
  J->trace = pGVar21;
  uVar17 = J->sizetrace;
  for (; uVar35 < uVar17; uVar35 = uVar35 + 1) {
    pGVar21[uVar35].gcptr32 = 0;
  }
  uVar25 = (ulong)J->freetrace;
LAB_001214c1:
  if ((int)uVar25 == 0) goto LAB_00121ecc;
  pGVar21[uVar25 & 0xffffffff].gcptr32 = (uint32_t)J;
  (J->cur).traceno = 0;
  (J->cur).link = 0;
  (J->cur).root = 0;
  (J->cur).nextroot = 0;
  (J->cur).nextside = 0;
  (J->cur).sinktags = '\0';
  (J->cur).unused1 = '\0';
  *(undefined4 *)&(J->cur).field_0x5c = 0;
  (J->cur).ir = (IRIns *)0x0;
  (J->cur).nk = 0;
  (J->cur).nsnap = 0;
  (J->cur).nsnapmap = 0;
  (J->cur).nextgc = 0;
  (J->cur).marked = '\0';
  (J->cur).gct = '\0';
  (J->cur).topslot = '\0';
  (J->cur).linktype = '\0';
  (J->cur).nins = 0;
  (J->cur).gclist = 0;
  (J->cur).startpt = 0;
  (J->cur).startpc = 0;
  (J->cur).startins = 0;
  (J->cur).szmcode = 0;
  (J->cur).mcode = (MCode *)0x0;
  (J->cur).mcloop = 0;
  (J->cur).nchild = 0;
  (J->cur).spadjust = 0;
  (J->cur).traceno = (TraceNo1)uVar25;
  (J->cur).nk = 0x8000;
  (J->cur).nins = 0x8000;
  (J->cur).ir = J->irbuf;
  pSVar29 = J->snapmapbuf;
  (J->cur).snap = J->snapbuf;
  (J->cur).snapmap = pSVar29;
  J->postproc = LJ_POST_NONE;
  J->mergesnap = '\0';
  J->needsnap = '\0';
  J->guardemit = '\0';
  J->bcskip = '\0';
  (J->cur).startpt.gcptr32 = *(uint32_t *)&J->pt;
  L = J->L;
  if (((*(byte *)((ulong)(L->glref).ptr32 + 0x93) & 2) != 0) &&
     (argbase = lj_vmevent_prepare(L,LJ_VMEVENT_TRACE), argbase != 0)) {
    pTVar9 = L->top;
    L->top = pTVar9 + 1;
    pGVar22 = lj_str_new(L,"start",5);
    (pTVar9->u32).lo = (uint32_t)pGVar22;
    (pTVar9->field_2).it = 0xfffffffb;
    pTVar9 = L->top;
    L->top = pTVar9 + 1;
    pTVar9->n = (double)(int)uVar25;
    pTVar9 = L->top;
    L->top = pTVar9 + 1;
    (pTVar9->field_2).field_0 =
         *(anon_union_4_2_de2f9c34_for_anon_struct_8_2_fd66bcdd_for_TValue_2_0 *)&J->fn;
    (pTVar9->field_2).it = 0xfffffff7;
    pTVar9 = L->top;
    L->top = pTVar9 + 1;
    pTVar9->n = (double)(int)((ulong)((long)J->pc + (-0x40 - (long)J->pt)) >> 2);
    TVar7 = J->parent;
    if (TVar7 != 0) {
      pTVar9 = L->top;
      L->top = pTVar9 + 1;
      pTVar9->n = (double)(int)TVar7;
      pTVar9 = L->top;
      L->top = pTVar9 + 1;
      pTVar9->n = (double)(int)J->exitno;
    }
    lj_vmevent_call(L,argbase);
  }
  J->bpropcache[0xe].key = 0;
  J->bpropcache[0xe].val = 0;
  J->bpropcache[0xe].mode = 0;
  J->bpropcache[0xf].key = 0;
  J->bpropcache[0xf].val = 0;
  J->bpropcache[0xf].mode = 0;
  J->bpropcache[0xc].key = 0;
  J->bpropcache[0xc].val = 0;
  J->bpropcache[0xc].mode = 0;
  J->bpropcache[0xd].key = 0;
  J->bpropcache[0xd].val = 0;
  J->bpropcache[0xd].mode = 0;
  J->bpropcache[10].key = 0;
  J->bpropcache[10].val = 0;
  J->bpropcache[10].mode = 0;
  J->bpropcache[0xb].key = 0;
  J->bpropcache[0xb].val = 0;
  J->bpropcache[0xb].mode = 0;
  J->bpropcache[8].key = 0;
  J->bpropcache[8].val = 0;
  J->bpropcache[8].mode = 0;
  J->bpropcache[9].key = 0;
  J->bpropcache[9].val = 0;
  J->bpropcache[9].mode = 0;
  J->bpropcache[6].key = 0;
  J->bpropcache[6].val = 0;
  J->bpropcache[6].mode = 0;
  J->bpropcache[7].key = 0;
  J->bpropcache[7].val = 0;
  J->bpropcache[7].mode = 0;
  J->bpropcache[4].key = 0;
  J->bpropcache[4].val = 0;
  J->bpropcache[4].mode = 0;
  J->bpropcache[5].key = 0;
  J->bpropcache[5].val = 0;
  J->bpropcache[5].mode = 0;
  J->bpropcache[2].key = 0;
  J->bpropcache[2].val = 0;
  J->bpropcache[2].mode = 0;
  J->bpropcache[3].key = 0;
  J->bpropcache[3].val = 0;
  J->bpropcache[3].mode = 0;
  J->bpropcache[0].key = 0;
  J->bpropcache[0].val = 0;
  J->bpropcache[0].mode = 0;
  J->bpropcache[1].key = 0;
  J->bpropcache[1].val = 0;
  J->bpropcache[1].mode = 0;
  lVar26 = 0;
  memset(J->chain,0,0x4b8);
  (J->scev).idx = 0x7fff;
  (J->scev).pc.ptr32 = 0;
  J->base = J->slot + 1;
  J->maxslot = 0;
  J->baseslot = 1;
  J->retdepth = 0;
  iVar13 = J->param[9];
  J->instunroll = J->param[8];
  J->loopunroll = iVar13;
  J->tailcalled = 0;
  J->framedepth = 0;
  J->loopref = 0;
  J->bc_min = (BCIns *)0x0;
  J->bc_extent = 0xffffffff;
  (J->fold).ins.field_0.ot = 0xd05;
  uVar3 = J->parent;
  uVar4 = J->exitno;
  auVar37._4_4_ = uVar4;
  auVar37._0_4_ = uVar3;
  auVar37._8_8_ = 0;
  auVar37 = pshuflw(auVar37,auVar37,0xe8);
  (J->fold).ins.field_1.op12 = auVar37._0_4_;
  lj_ir_emit(J);
  lVar23 = 0x3fffe;
  for (; lVar26 != 3; lVar26 = lVar26 + 1) {
    pIVar36 = (J->cur).ir;
    *(undefined4 *)((long)pIVar36 + lVar23 + -6) = 0;
    *(char *)((long)pIVar36 + lVar23 + -2) = (char)lVar26;
    *(undefined1 *)((long)pIVar36 + lVar23 + -1) = 0x15;
    *(undefined2 *)((long)pIVar36 + lVar23) = 0;
    lVar23 = lVar23 + -8;
  }
  (J->cur).nk = 0x7ffd;
  pGVar24 = (GCproto *)J->pc;
  J->startpc = (BCIns *)pGVar24;
  (J->cur).startpc.ptr32 = (uint32_t)pGVar24;
  uVar17 = J->parent;
  if ((ulong)uVar17 != 0) {
    T = (GCtrace *)(ulong)J->trace[uVar17].gcptr32;
    if (T->root != 0) {
      uVar17 = (uint)T->root;
    }
    (J->cur).root = (TraceNo1)uVar17;
    (J->cur).startins = 0x54;
    uVar25 = (ulong)J->exitno;
    pSVar10 = T->snap;
    if ((uVar25 == 0) && (pSVar10->nent == '\0')) {
      if (((J->pt + 1 < pGVar24) && (uVar32 = pGVar24[-1].varinfo.ptr32, (char)uVar32 == 'J')) &&
         (*(ushort *)((long)pGVar24 + (ulong)(uVar32 >> 0x10) * 4 + -0x20002) == uVar17)) {
        lj_snap_add(J);
        rec_for_loop(J,J->pc + -1,&J->scev,1);
        goto LAB_00121f38;
      }
    }
    else {
      J->startpc = (BCIns *)0x0;
    }
    pSVar29 = T->snapmap + pSVar10[uVar25].mapofs;
    bVar5 = pSVar10[uVar25].nent;
    uVar35 = (ulong)bVar5;
    J->framedepth = 0;
    bVar12 = false;
    local_78 = 0;
    for (uVar30 = 0; uVar35 != uVar30; uVar30 = uVar30 + 1) {
      uVar17 = pSVar29[uVar30];
      uVar32 = uVar17 >> 0x18;
      pIVar36 = (IRIns *)((ulong)((uVar17 & 0xffff) * 8) + (long)T->ir);
      if (((local_78 >> ((ulong)uVar17 & 0x3f) & 1) == 0) ||
         (TVar18 = snap_dedup(J,pSVar29,(MSize)uVar30,uVar17 & 0xffff), TVar18 == 0)) {
        local_78 = 1L << ((byte)uVar17 & 0x3f) | local_78;
        if ((uVar17 & 0xffff) < 0x8000) {
          TVar18 = snap_replay_const(J,pIVar36);
        }
        else if (((pIVar36->field_0).prev & 0xff80) == 0x80) {
          bVar12 = true;
          TVar18 = uVar32;
        }
        else {
          uVar14 = 0x21;
          if ((pIVar36->field_1).o == 'E') {
            uVar14 = (pIVar36->field_0).op2 & 0x10 | 0x21;
          }
          (J->fold).ins.field_0.ot = (pIVar36->field_1).t.irt & 0x1f | 0x4500;
          *(ushort *)&(J->fold).ins = (ushort)(byte)(uVar17 >> 0x18);
          (J->fold).ins.field_0.op2 = uVar14;
          TVar18 = lj_ir_emit(J);
        }
      }
      J->slot[uVar32] = TVar18 | uVar17 & 0x30000;
      J->framedepth = J->framedepth + (uint)(0xffffff < uVar17 && (uVar17 & 0x30000) != 0);
      if ((uVar17 >> 0x10 & 1) != 0) {
        J->baseslot = uVar32 + 1;
      }
    }
    if (bVar12) {
      uVar14 = pSVar10[uVar25].ref;
      pIVar36 = T->ir;
      bVar12 = false;
      for (uVar30 = 0; uVar17 = (uint)bVar5, uVar30 != uVar35; uVar30 = uVar30 + 1) {
        uVar32 = pSVar29[uVar30];
        uVar33 = uVar32 & 0xffff;
        pIVar28 = T->ir;
        pIVar31 = pIVar28 + uVar33;
        if ((pIVar31->field_1).r == 0xfd) {
          if (J->slot[uVar32 >> 0x18] == uVar32 >> 0x18) {
            uVar32 = T->nk;
            if (uVar32 <= (pIVar31->field_0).op1) {
              snap_pref(J,T,pSVar29,uVar17,local_78,(uint)(pIVar31->field_0).op1);
              uVar32 = T->nk;
            }
            if (uVar32 <= (pIVar31->field_0).op2) {
              snap_pref(J,T,pSVar29,uVar17,local_78,(uint)(pIVar31->field_0).op2);
            }
            bVar12 = true;
            if ((pIVar31->field_1).o != 'Q') {
              for (pIVar28 = pIVar28 + (ulong)uVar33 + 1; pIVar28 < pIVar36 + uVar14;
                  pIVar28 = pIVar28 + 1) {
                if ((pIVar28->field_1).r == 0xfe) {
                  if ((ulong)(pIVar28->field_1).s == 0xff) {
                    uVar32 = snap_sunk_store2(T,pIVar31,pIVar28);
                  }
                  else {
                    uVar32 = (uint)(pIVar28 == pIVar31 + (pIVar28->field_1).s);
                  }
                  if ((uVar32 != 0) &&
                     (TVar18 = snap_pref(J,T,pSVar29,uVar17,local_78,(uint)(pIVar28->field_0).op2),
                     TVar18 == 0)) {
                    snap_pref(J,T,pSVar29,uVar17,local_78,
                              (uint)T->ir[(pIVar28->field_0).op2].field_0.op1);
                  }
                }
              }
              bVar12 = true;
            }
          }
        }
        else if ((0x7fff < uVar33) && (((pIVar31->field_0).prev & 0xff80) == 0x80)) {
          TVar18 = snap_pref(J,T,pSVar29,uVar17,local_78,(uint)(pIVar31->field_0).op1);
          J->slot[uVar32 >> 0x18] = TVar18;
        }
      }
      if (bVar12) {
        for (uVar30 = 0; uVar30 != uVar35; uVar30 = uVar30 + 1) {
          uVar34 = (ulong)(pSVar29[uVar30] & 0xffff);
          pIVar28 = T->ir;
          if (*(char *)((long)pIVar28 + uVar34 * 8 + 6) == -3) {
            uVar32 = pSVar29[uVar30] >> 0x18;
            if (J->slot[uVar32] == uVar32) {
              pIVar31 = pIVar28 + uVar34;
              uVar27 = (pIVar31->field_0).op1;
              uVar33 = T->nk;
              if (uVar33 <= uVar27) {
                TVar18 = snap_pref(J,T,pSVar29,uVar17,local_78,(uint)uVar27);
                uVar27 = (ushort)TVar18;
                uVar33 = T->nk;
              }
              uVar15 = (pIVar31->field_0).op2;
              if (uVar33 <= uVar15) {
                TVar18 = snap_pref(J,T,pSVar29,uVar17,local_78,(uint)uVar15);
                uVar15 = (ushort)TVar18;
              }
              if ((pIVar31->field_1).o != 'Q') {
                (J->fold).ins.field_0.ot = (pIVar31->field_0).ot;
                (J->fold).ins.field_0.op1 = uVar27;
                (J->fold).ins.field_0.op2 = uVar15;
                TVar18 = lj_opt_fold(J);
                J->slot[uVar32] = TVar18;
                pIVar28 = pIVar28 + uVar34;
LAB_00121c76:
                irs = pIVar28 + 1;
                if (irs < pIVar36 + uVar14) {
                  if (*(char *)((long)pIVar28 + 0xe) != -2) goto LAB_00121cd7;
                  if ((ulong)*(byte *)((long)pIVar28 + 0xf) == 0xff) {
                    uVar32 = snap_sunk_store2(T,pIVar31,irs);
                  }
                  else {
                    uVar32 = (uint)(irs == pIVar31 + *(byte *)((long)pIVar28 + 0xf));
                  }
                  if (uVar32 == 0) goto LAB_00121cd7;
                  pIVar11 = T->ir;
                  uVar34 = (ulong)(irs->field_0).op1;
                  uVar27 = *(ushort *)((long)pIVar11 + uVar34 * 8 + 2);
                  cVar6 = *(char *)((long)pIVar11 + uVar34 * 8 + 5);
                  IVar16 = (IRRef1)TVar18;
                  if (cVar6 != '>') {
                    ir = pIVar11 + uVar27;
                    if (cVar6 == '9') {
                      TVar19 = snap_replay_const(J,pIVar11 + (ir->field_0).op1);
                      TVar19 = lj_ir_kslot(J,TVar19,(uint)(ir->field_0).op2);
                      uVar27 = (ushort)TVar19;
                    }
                    else {
                      TVar19 = snap_replay_const(J,ir);
                      uVar27 = (ushort)TVar19;
                    }
                    if ((*(byte *)((long)pIVar11 + uVar34 * 8 + 5) & 0xfe) == 0x38) {
                      uVar8 = *(undefined4 *)
                               ((long)T->ir + (ulong)pIVar11[uVar34].field_0.op1 * 8 + 2);
                      (J->fold).ins.field_0.op1 = IVar16;
                      *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = uVar8;
                      TVar19 = lj_opt_fold(J);
                      IVar16 = (IRRef1)TVar19;
                    }
                  }
                  (J->fold).ins.field_0.ot = *(IROpT *)((long)pIVar11 + uVar34 * 8 + 4);
                  (J->fold).ins.field_0.op1 = IVar16;
                  (J->fold).ins.field_0.op2 = uVar27;
                  TVar19 = lj_opt_fold(J);
                  TVar20 = snap_pref(J,T,pSVar29,uVar17,local_78,
                                     (uint)*(ushort *)((long)pIVar28 + 10));
                  if (TVar20 == 0) {
                    TVar20 = snap_pref(J,T,pSVar29,uVar17,local_78,
                                       (uint)T->ir[*(ushort *)((long)pIVar28 + 10)].field_0.op1);
                    (J->fold).ins.field_0.op1 = (IRRef1)TVar20;
                    *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x550e01d3;
                    TVar20 = lj_opt_fold(J);
                  }
                  (J->fold).ins.field_0.ot = *(IROpT *)((long)pIVar28 + 0xc);
                  (J->fold).ins.field_0.op1 = (IRRef1)TVar19;
                  (J->fold).ins.field_0.op2 = (IRRef1)TVar20;
                  goto LAB_00121e3c;
                }
                goto LAB_00121c2b;
              }
              (J->fold).ins.field_0.ot = (pIVar31->field_0).ot & 0xff9f;
              (J->fold).ins.field_0.op1 = uVar27;
              (J->fold).ins.field_0.op2 = uVar15;
              TVar18 = lj_opt_fold(J);
            }
            else {
              TVar18 = J->slot[J->slot[uVar32]];
            }
            J->slot[uVar32] = TVar18;
          }
LAB_00121c2b:
        }
        J->base = J->slot + J->baseslot;
        J->maxslot = (uint)pSVar10[uVar25].nslots - J->baseslot;
        lj_snap_add(J);
        (J->fold).ins.field_0.ot = 0xf80;
        (J->fold).ins.field_1.op12 = 0;
        lj_ir_emit(J);
        goto LAB_00121f38;
      }
    }
    J->base = J->slot + J->baseslot;
    J->maxslot = (uint)pSVar10[uVar25].nslots - J->baseslot;
    lj_snap_add(J);
LAB_00121f38:
    if (((int)(uint)*(ushort *)((ulong)J->trace[(J->cur).root].gcptr32 + 0x4c) < J->param[3]) &&
       ((int)(uint)T->snap[J->exitno].count < J->param[7] + J->param[6])) {
      return;
    }
    rec_stop(J,LJ_TRLINK_INTERP,0);
    return;
  }
  (J->cur).root = 0;
  uVar17 = (pGVar24->nextgc).gcptr32;
  (J->cur).startins = uVar17;
  if (0xf < (uVar17 & 0xff) - 0x46) goto switchD_00121e83_caseD_49;
  uVar32 = uVar17 >> 8 & 0xff;
  switch(uVar17 & 0xff) {
  case 0x46:
  case 0x47:
  case 0x48:
    J->maxslot = ((uVar17 >> 0x10) + uVar32) - 1;
    break;
  case 0x4e:
    J->maxslot = (uVar32 + *(byte *)((long)&pGVar24[-1].varinfo.ptr32 + 3)) - 1;
  case 0x4b:
    uVar17 = uVar17 >> 0xe & 0xfffffffc;
    J->bc_extent = 0x20000 - uVar17;
    pGVar24 = (GCproto *)((long)pGVar24 + ((ulong)uVar17 - 0x1fffc));
    J->bc_min = (BCIns *)pGVar24;
    break;
  case 0x51:
    uVar33 = (&pGVar24[-0x800].nextgc)[uVar17 >> 0x10].gcptr32;
    if ((uVar33 & 0x800000ff) == 0x54) {
      uVar33 = uVar33 >> 0xe & 0xfffffffc;
      J->bc_min = (BCIns *)((long)pGVar24 + (ulong)uVar33 + (ulong)(uVar17 >> 0x10) * 4 + -0x3fffc);
      J->bc_extent = 0x20000 - uVar33;
    }
    J->maxslot = uVar32;
    goto LAB_00122044;
  case 0x55:
    J->maxslot = (uint)J->pt->numparams;
LAB_00122044:
    pGVar24 = (GCproto *)&pGVar24->marked;
  }
switchD_00121e83_caseD_49:
  J->pc = (BCIns *)pGVar24;
  lj_snap_add(J);
  if ((char)(J->cur).startins == 'K') {
    rec_for_loop(J,J->pc + -1,&J->scev,1);
  }
  if (J->pt->framesize < 0xf9) {
    return;
  }
  lj_trace_err(J,LJ_TRERR_STACKOV);
LAB_00121cd7:
  pcVar2 = (char *)((long)pIVar28 + 0xd);
  pIVar28 = irs;
  if ((*pcVar2 == 'T') && ((pIVar31->field_1).o == 'P')) {
    (J->fold).ins.field_0.ot = 0x5400;
    (J->fold).ins.field_1.op12 = 0;
LAB_00121e3c:
    lj_opt_fold(J);
    pIVar28 = irs;
  }
  goto LAB_00121c76;
}

Assistant:

static void trace_start(jit_State *J)
{
  lua_State *L;
  TraceNo traceno;

  if ((J->pt->flags & PROTO_NOJIT)) {  /* JIT disabled for this proto? */
    if (J->parent == 0) {
      /* Lazy bytecode patching to disable hotcount events. */
      lua_assert(bc_op(*J->pc) == BC_FORL || bc_op(*J->pc) == BC_ITERL ||
		 bc_op(*J->pc) == BC_LOOP || bc_op(*J->pc) == BC_FUNCF);
      setbc_op(J->pc, (int)bc_op(*J->pc)+(int)BC_ILOOP-(int)BC_LOOP);
      J->pt->flags |= PROTO_ILOOP;
    }
    J->state = LJ_TRACE_IDLE;  /* Silently ignored. */
    return;
  }

  /* Get a new trace number. */
  traceno = trace_findfree(J);
  if (LJ_UNLIKELY(traceno == 0)) {  /* No free trace? */
    lua_assert((J2G(J)->hookmask & HOOK_GC) == 0);
    lj_trace_flushall(J->L);
    J->state = LJ_TRACE_IDLE;  /* Silently ignored. */
    return;
  }
  setgcrefp(J->trace[traceno], &J->cur);

  /* Setup enough of the current trace to be able to send the vmevent. */
  memset(&J->cur, 0, sizeof(GCtrace));
  J->cur.traceno = traceno;
  J->cur.nins = J->cur.nk = REF_BASE;
  J->cur.ir = J->irbuf;
  J->cur.snap = J->snapbuf;
  J->cur.snapmap = J->snapmapbuf;
  J->mergesnap = 0;
  J->needsnap = 0;
  J->bcskip = 0;
  J->guardemit.irt = 0;
  J->postproc = LJ_POST_NONE;
  lj_resetsplit(J);
  setgcref(J->cur.startpt, obj2gco(J->pt));

  L = J->L;
  lj_vmevent_send(L, TRACE,
    setstrV(L, L->top++, lj_str_newlit(L, "start"));
    setintV(L->top++, traceno);
    setfuncV(L, L->top++, J->fn);
    setintV(L->top++, proto_bcpos(J->pt, J->pc));
    if (J->parent) {
      setintV(L->top++, J->parent);
      setintV(L->top++, J->exitno);
    }
  );
  lj_record_setup(J);
}